

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int __thiscall ON_String::ReverseFind(ON_String *this,char utf8_single_byte_c)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ON_Internal_Empty_aString *pOVar6;
  char *pcVar7;
  
  pOVar6 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  if (this->m_s == (char *)0x0) {
    pOVar6 = &empty_astring;
  }
  if ((0 < (pOVar6->header).string_length) &&
     (iVar3 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c), iVar3 != 0)) {
    pcVar1 = this->m_s;
    pOVar6 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
    if (pcVar1 == (char *)0x0) {
      pOVar6 = &empty_astring;
    }
    uVar5 = (ulong)(pOVar6->header).string_length;
    pcVar2 = pcVar1 + uVar5;
    do {
      pcVar7 = pcVar2;
      uVar4 = (uint)uVar5;
      if (pcVar7 <= pcVar1) break;
      uVar4 = uVar4 - 1;
      uVar5 = (ulong)uVar4;
      pcVar2 = pcVar7 + -1;
    } while (pcVar7[-1] != utf8_single_byte_c);
    if (pcVar1 < pcVar7) {
      return uVar4;
    }
  }
  return -1;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}